

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::(anonymous_namespace)::TimestampTestParam::generateTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  undefined1 in_CL;
  uint *puVar1;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Record timestamp after ",(allocator<char> *)&local_50
            );
  for (puVar1 = *(uint **)((long)this + 8); puVar1 != *(uint **)((long)this + 0x10);
      puVar1 = puVar1 + 1) {
    if (*puVar1 != 1) {
      getPipelineStageFlagStr_abi_cxx11_
                (&local_70,(_anonymous_namespace_ *)(ulong)*puVar1,VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT
                 ,(bool)in_CL);
      std::operator+(&local_50,&local_70,' ');
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string TimestampTestParam::generateTestDescription(void) const
{
	std::string result("Record timestamp after ");

	for (StageFlagVector::const_iterator it = m_stageVec.begin(); it != m_stageVec.end(); it++)
	{
		if(*it != VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT)
		{
			result += getPipelineStageFlagStr(*it, true) + ' ';
		}
	}
	if(m_inRenderPass)
		result += " in the renderpass";
	else
		result += " out of the render pass";

	return result;
}